

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O1

void __thiscall Face::print_triangle(Face *this,Corner ref_corner,int layer,int entry)

{
  iterator iVar1;
  ulong uVar2;
  Position lookup_pos;
  key_type local_c;
  
  local_c.reference_corner = ref_corner;
  local_c.layer = layer;
  local_c.entry = entry;
  iVar1 = std::
          _Rb_tree<Position,_std::pair<const_Position,_Color_*>,_std::_Select1st<std::pair<const_Position,_Color_*>_>,_std::less<Position>,_std::allocator<std::pair<const_Position,_Color_*>_>_>
          ::find(&(this->current_state)._M_t,&local_c);
  uVar2 = (ulong)(iVar1._M_node[1]._M_left)->_M_color;
  if (uVar2 < 4) {
    printf(&DAT_00108514 + *(int *)(&DAT_00108514 + uVar2 * 4));
  }
  return;
}

Assistant:

void Face::print_triangle(Corner ref_corner, int layer, int entry){
    Color triangle_color = get_triangle_color(ref_corner, layer, entry);
    switch (triangle_color)
    {
    case Color::blue:
        printf("\033[1;34mB\033[0m");
        break;
    case Color::red:
        printf("\033[1;31mR\033[0m");
        break;             
    case Color::yellow:
        printf("\033[1;33mY\033[0m");
        break;
    case Color::green:
        printf("\033[1;32mG\033[0m");
        break;
    default:
        break;
    }
}